

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

void __thiscall
pybind11::class_<Animal,_PyAnimal>::class_<>(class_<Animal,_PyAnimal> *this,handle scope,char *name)

{
  mapped_type pvVar1;
  internals *piVar2;
  mapped_type *ppvVar3;
  type_index local_98;
  type_index local_90;
  internals *local_88;
  unordered_map<std::type_index,_void_*,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_void_*>_>_>
  *instances;
  bool unused [2];
  undefined1 local_70 [8];
  type_record record;
  char *name_local;
  class_<Animal,_PyAnimal> *this_local;
  handle scope_local;
  
  record._72_8_ = name;
  detail::generic_type::generic_type(&this->super_generic_type);
  detail::type_record::type_record((type_record *)local_70);
  record.scope.m_ptr = (PyObject *)record._72_8_;
  record.name = "";
  record.type = (type_info *)0x8;
  record.type_size = 0x30;
  record.instance_size = (size_t)init_holder;
  record.init_holder = dealloc;
  local_70 = (undefined1  [8])scope.m_ptr;
  add_base<PyAnimal,_0>((type_record *)local_70);
  instances._2_1_ = 0;
  instances._3_1_ = 0;
  detail::process_attributes<>::init((EVP_PKEY_CTX *)local_70);
  detail::generic_type::initialize(&this->super_generic_type,(type_record *)local_70);
  piVar2 = detail::get_internals();
  local_88 = piVar2;
  std::type_index::type_index(&local_90,(type_info *)&Animal::typeinfo);
  ppvVar3 = std::
            unordered_map<std::type_index,_void_*,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_void_*>_>_>
            ::operator[](&piVar2->registered_types_cpp,&local_90);
  piVar2 = local_88;
  pvVar1 = *ppvVar3;
  std::type_index::type_index(&local_98,(type_info *)&PyAnimal::typeinfo);
  ppvVar3 = std::
            unordered_map<std::type_index,_void_*,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_void_*>_>_>
            ::operator[](&piVar2->registered_types_cpp,&local_98);
  *ppvVar3 = pvVar1;
  detail::type_record::~type_record((type_record *)local_70);
  return;
}

Assistant:

class_(handle scope, const char *name, const Extra &... extra) {
        detail::type_record record;
        record.scope = scope;
        record.name = name;
        record.type = &typeid(type);
        record.type_size = sizeof(detail::conditional_t<has_alias, type_alias, type>);
        record.instance_size = sizeof(instance_type);
        record.init_holder = init_holder;
        record.dealloc = dealloc;

        /* Register base classes specified via template arguments to class_, if any */
        bool unused[] = { (add_base<options>(record), false)..., false };
        (void) unused;

        /* Process optional arguments, if any */
        detail::process_attributes<Extra...>::init(extra..., &record);

        detail::generic_type::initialize(&record);

        if (has_alias) {
            auto &instances = pybind11::detail::get_internals().registered_types_cpp;
            instances[std::type_index(typeid(type_alias))] = instances[std::type_index(typeid(type))];
        }
    }